

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

int * __thiscall ConvexDecomposition::cbtHullTriangle::neib(cbtHullTriangle *this,int a,int b)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int *in_RAX;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  long lVar7;
  
  piVar5 = &(this->n).z;
  uVar4 = 2;
  lVar7 = 0;
  do {
    if (lVar7 == 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x943,"int &ConvexDecomposition::cbtHullTriangle::neib(int, int)");
    }
    iVar2 = (int)lVar7;
    uVar6 = (ulong)(iVar2 + 1);
    if (lVar7 == 2) {
      uVar6 = 0;
    }
    iVar1 = (&(this->super_int3).x)[lVar7];
    if ((iVar1 == a) && ((&(this->super_int3).x)[uVar6] == b)) {
      in_RAX = piVar5 + (uVar4 / 3) * -3;
LAB_00930b1f:
      bVar3 = false;
    }
    else {
      bVar3 = true;
      if ((iVar1 == b) && ((&(this->super_int3).x)[uVar6] == a)) {
        in_RAX = &(this->n).x + (iVar2 + 2 + ((iVar2 + 2U) / 3) * -3);
        goto LAB_00930b1f;
      }
    }
    piVar5 = piVar5 + 1;
    uVar4 = uVar4 + 1;
    lVar7 = lVar7 + 1;
    if (!bVar3) {
      return in_RAX;
    }
  } while( true );
}

Assistant:

int &cbtHullTriangle::neib(int a,int b)
{
	static int er=-1;
	int i;
	for(i=0;i<3;i++) 
	{
		int i1=(i+1)%3;
		int i2=(i+2)%3;
		if((*this)[i]==a && (*this)[i1]==b) return n[i2];
		if((*this)[i]==b && (*this)[i1]==a) return n[i2];
	}
	assert(0);
	return er;
}